

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

fsg_arciter_t * fsg_model_arcs(fsg_model_t *fsg,int32 i)

{
  undefined8 uVar1;
  hash_iter_t *phVar2;
  fsg_arciter_t *itor;
  int32 i_local;
  fsg_model_t *fsg_local;
  
  if ((fsg->trans[i].trans == (hash_table_t *)0x0) &&
     (fsg->trans[i].null_trans == (hash_table_t *)0x0)) {
    fsg_local = (fsg_model_t *)0x0;
  }
  else {
    fsg_local = (fsg_model_t *)
                __ckd_calloc__(1,0x18,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                               ,0x122);
    if (fsg->trans[i].null_trans != (hash_table_t *)0x0) {
      phVar2 = hash_table_iter(fsg->trans[i].null_trans);
      fsg_local->name = (char *)phVar2;
    }
    if (fsg->trans[i].trans != (hash_table_t *)0x0) {
      phVar2 = hash_table_iter(fsg->trans[i].trans);
      *(hash_iter_t **)fsg_local = phVar2;
    }
    if (*(long *)fsg_local != 0) {
      uVar1 = *(undefined8 *)(*(long *)(*(long *)fsg_local + 8) + 0x10);
      fsg_local->n_word = (int)uVar1;
      fsg_local->n_word_alloc = (int)((ulong)uVar1 >> 0x20);
    }
  }
  return (fsg_arciter_t *)fsg_local;
}

Assistant:

fsg_arciter_t *
fsg_model_arcs(fsg_model_t * fsg, int32 i)
{
    fsg_arciter_t *itor;

    if (fsg->trans[i].trans == NULL && fsg->trans[i].null_trans == NULL)
        return NULL;
    itor = ckd_calloc(1, sizeof(*itor));
    if (fsg->trans[i].null_trans)
        itor->null_itor = hash_table_iter(fsg->trans[i].null_trans);
    if (fsg->trans[i].trans)
        itor->itor = hash_table_iter(fsg->trans[i].trans);
    if (itor->itor != NULL)
        itor->gn = hash_entry_val(itor->itor->ent);
    return itor;
}